

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O2

void __thiscall
Centaurus::DFA<unsigned_char>::DFA
          (DFA<unsigned_char> *this,NFA<unsigned_char> *nfa,bool optimize_flag)

{
  pointer pNVar1;
  pointer pNVar2;
  pointer pDVar3;
  bool bVar4;
  DFAState<unsigned_char> *state;
  pointer this_00;
  bool long_flag;
  IndexVector local_80;
  set<int,_std::less<int>,_std::allocator<int>_> ec0;
  
  (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_00192d08;
  long_flag = false;
  NFA<unsigned_char>::epsilon_closure(&ec0,nfa,0,&long_flag);
  IndexVector::IndexVector<std::_Rb_tree_const_iterator<int>>
            (&local_80,
             (_Rb_tree_const_iterator<int>)ec0._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<int>)&ec0._M_t._M_impl.super__Rb_tree_header);
  std::vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
  ::emplace_back<Centaurus::IndexVector,bool&>
            ((vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
              *)&(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states,&local_80,
             &long_flag);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_80.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>);
  fork_states(this,0,nfa);
  pNVar1 = (nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar2 = (nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                 super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pDVar3; this_00 = this_00 + 1
      ) {
    bVar4 = IndexVector::includes
                      (&(this_00->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).m_label
                       ,(int)(((long)pNVar1 - (long)pNVar2) / 0x28) + -1);
    if (bVar4) {
      this_00->m_accept = true;
    }
    NFABaseState<unsigned_char,_Centaurus::IndexVector>::sort
              (&this_00->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>);
  }
  if (optimize_flag) {
    minimize(this);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&ec0._M_t);
  return;
}

Assistant:

DFA(const NFA<TCHAR>& nfa, bool optimize_flag = true)
	{
		//Start by collecting the epsilon closure of start state
        bool long_flag = false;
		std::set<int> ec0 = nfa.epsilon_closure(0, long_flag);

		//Create the start state
		m_states.emplace_back(IndexVector(ec0.cbegin(), ec0.cend()), long_flag);

		//Recursively construct the DFA
		fork_states(0, nfa);

		int accept_state_index = nfa.get_state_num() - 1;

		for (auto& state : m_states)
		{
			if (state.label().includes(accept_state_index))
			{
				//state.add_transition(CharClass<TCHAR>(), -1);
				state.set_accept();
			}

            state.sort();
		}

        if (optimize_flag)
            minimize();
	}